

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_compression_type.cpp
# Opt level: O3

bool duckdb::IsFileCompressed(string *path,FileCompressionType type)

{
  pointer pcVar1;
  bool bVar2;
  FileCompressionType in_DL;
  undefined7 in_register_00000031;
  string extension;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  CompressionExtensionFromType_abi_cxx11_
            (&local_60,(duckdb *)CONCAT71(in_register_00000031,type),in_DL);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + path->_M_string_length);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"\\\\?\\","");
  bVar2 = StringUtil::StartsWith(&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (!bVar2) {
    ::std::__cxx11::string::find((char)path,0x3f);
  }
  ::std::__cxx11::string::substr((ulong)local_40,(ulong)path);
  ::std::__cxx11::string::operator=((string *)path,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  bVar2 = StringUtil::EndsWith(path,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool IsFileCompressed(string path, FileCompressionType type) {
	auto extension = CompressionExtensionFromType(type);
	std::size_t question_mark_pos = std::string::npos;
	if (!StringUtil::StartsWith(path, "\\\\?\\")) {
		question_mark_pos = path.find('?');
	}
	path = path.substr(0, question_mark_pos);
	if (StringUtil::EndsWith(path, extension)) {
		return true;
	}
	return false;
}